

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testNNValidatorSimple(void)

{
  pointer pcVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  Type *pTVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  TypeUnion this;
  Type *this_00;
  LayerUnion this_01;
  WeightParams *this_02;
  ostream *poVar7;
  int iVar8;
  Result res;
  Model m1;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_50.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5 == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar6 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  iVar8 = (pAVar6->shape_).current_size_;
  if (iVar8 == (pAVar6->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar6->shape_,iVar8 + 1);
    iVar8 = (pAVar6->shape_).current_size_;
  }
  (pAVar6->shape_).current_size_ = iVar8 + 1;
  ((pAVar6->shape_).rep_)->elements[iVar8] = 1;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_50.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5 == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar6 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar6 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar6);
    (pFVar5->Type_).multiarraytype_ = pAVar6;
  }
  iVar8 = (pAVar6->shape_).current_size_;
  if (iVar8 == (pAVar6->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar6->shape_,iVar8 + 1);
    iVar8 = (pAVar6->shape_).current_size_;
  }
  (pAVar6->shape_).current_size_ = iVar8 + 1;
  ((pAVar6->shape_).rep_)->elements[iVar8] = 1;
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  if (this_00->_oneof_case_[0] == 0x8c) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x8c;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01.innerproduct_);
    (this_00->layer_).innerproduct_ = (InnerProductLayerParams *)this_01;
  }
  (this_01.innerproduct_)->inputchannels_ = 1;
  (this_01.innerproduct_)->outputchannels_ = 1;
  this_02 = (WeightParams *)((this_01.activation_)->NonlinearityType_).relu_;
  if (this_02 == (WeightParams *)0x0) {
    this_02 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(this_02);
    ((this_01.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)this_02;
  }
  iVar8 = (this_02->floatvalue_).current_size_;
  if (iVar8 == (this_02->floatvalue_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&this_02->floatvalue_,iVar8 + 1);
    iVar8 = (this_02->floatvalue_).current_size_;
  }
  (this_02->floatvalue_).current_size_ = iVar8 + 1;
  ((this_02->floatvalue_).rep_)->elements[iVar8] = 1.0;
  (this_01.innerproduct_)->hasbias_ = false;
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar2 = CoreML::Result::good((Result *)local_78);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)!bVar2;
}

Assistant:

int testNNValidatorSimple() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(1);

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input("input");
    innerProductLayer->add_output("output");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);
    innerProductParams->mutable_weights()->add_floatvalue(1.0);

    innerProductParams->set_hasbias(false);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    return 0;
}